

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::NetworkUpdateParameters::ByteSizeLong(NetworkUpdateParameters *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Type *this_00;
  size_t sVar4;
  uint index;
  size_t sVar5;
  
  uVar3 = (this->losslayers_).super_RepeatedPtrFieldBase.current_size_;
  sVar5 = (size_t)uVar3;
  if (sVar5 == 0) {
    sVar5 = 0;
  }
  else {
    index = 0;
    do {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                          (&(this->losslayers_).super_RepeatedPtrFieldBase,index);
      sVar4 = LossLayer::ByteSizeLong(this_00);
      uVar2 = (uint)sVar4 | 1;
      iVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar3 != index);
  }
  if (this != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_ &&
      this->optimizer_ != (Optimizer *)0x0) {
    sVar4 = Optimizer::ByteSizeLong(this->optimizer_);
    uVar3 = (uint)sVar4 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar5 = sVar5 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->epochs_ != (Int64Parameter *)0x0 &&
      this != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) {
    sVar4 = Int64Parameter::ByteSizeLong(this->epochs_);
    uVar3 = (uint)sVar4 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar5 = sVar5 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->shuffle_ != (BoolParameter *)0x0 &&
      this != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) {
    sVar4 = BoolParameter::ByteSizeLong(this->shuffle_);
    uVar3 = (uint)sVar4 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar5 = sVar5 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->seed_ != (Int64Parameter *)0x0 &&
      this != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) {
    sVar4 = Int64Parameter::ByteSizeLong(this->seed_);
    uVar3 = (uint)sVar4 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar5 = sVar5 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t NetworkUpdateParameters::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NetworkUpdateParameters)
  size_t total_size = 0;

  // repeated .CoreML.Specification.LossLayer lossLayers = 1;
  {
    unsigned int count = this->losslayers_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->losslayers(i));
    }
  }

  // .CoreML.Specification.Optimizer optimizer = 2;
  if (this->has_optimizer()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->optimizer_);
  }

  // .CoreML.Specification.Int64Parameter epochs = 3;
  if (this->has_epochs()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->epochs_);
  }

  // .CoreML.Specification.BoolParameter shuffle = 10;
  if (this->has_shuffle()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->shuffle_);
  }

  // .CoreML.Specification.Int64Parameter seed = 20;
  if (this->has_seed()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->seed_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}